

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_constant.cpp
# Opt level: O1

void duckdb::ConstantScanPartial<float>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  data_ptr_t pdVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  long lVar4;
  float fVar5;
  int iVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  
  pdVar1 = result->data;
  fVar5 = NumericStats::GetMin<float>(&(segment->stats).statistics);
  auVar2 = _DAT_01352200;
  if (scan_count != 0) {
    lVar4 = scan_count - 1;
    auVar6._8_4_ = (int)lVar4;
    auVar6._0_8_ = lVar4;
    auVar6._12_4_ = (int)((ulong)lVar4 >> 0x20);
    uVar3 = 0;
    auVar6 = auVar6 ^ _DAT_01352200;
    auVar8 = _DAT_0135a330;
    auVar9 = _DAT_0135a310;
    do {
      auVar10 = auVar9 ^ auVar2;
      iVar7 = auVar6._4_4_;
      if ((bool)(~(auVar10._4_4_ == iVar7 && auVar6._0_4_ < auVar10._0_4_ || iVar7 < auVar10._4_4_)
                & 1)) {
        *(float *)(pdVar1 + uVar3 * 4 + result_offset * 4) = fVar5;
      }
      if ((auVar10._12_4_ != auVar6._12_4_ || auVar10._8_4_ <= auVar6._8_4_) &&
          auVar10._12_4_ <= auVar6._12_4_) {
        *(float *)(pdVar1 + uVar3 * 4 + result_offset * 4 + 4) = fVar5;
      }
      auVar10 = auVar8 ^ auVar2;
      iVar11 = auVar10._4_4_;
      if (iVar11 <= iVar7 && (iVar11 != iVar7 || auVar10._0_4_ <= auVar6._0_4_)) {
        *(float *)(pdVar1 + uVar3 * 4 + result_offset * 4 + 8) = fVar5;
        *(float *)(pdVar1 + uVar3 * 4 + result_offset * 4 + 0xc) = fVar5;
      }
      uVar3 = uVar3 + 4;
      lVar4 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar4 + 4;
      lVar4 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 4;
      auVar8._8_8_ = lVar4 + 4;
    } while ((scan_count + 3 & 0xfffffffffffffffc) != uVar3);
  }
  return;
}

Assistant:

void ConstantScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                         idx_t result_offset) {
	ConstantFillFunction<T>(segment, result, result_offset, scan_count);
}